

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

char * unescape_word(char *input)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  dynbuf out;
  
  Curl_dyn_init(&out,10000);
  while( true ) {
    bVar1 = *input;
    if (bVar1 == 0) {
      pcVar3 = Curl_dyn_ptr(&out);
      return pcVar3;
    }
    if ((((byte)(bVar1 + 0x81) < 0xa2) ||
        ((bVar1 - 0x22 < 0x3b && ((0x400000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))
        ) && (CVar2 = Curl_dyn_addn(&out,"\\",1), CVar2 != CURLE_OK)) break;
    CVar2 = Curl_dyn_addn(&out,input,1);
    input = (char *)((byte *)input + 1);
    if (CVar2 != CURLE_OK) {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *unescape_word(const char *input)
{
  struct dynbuf out;
  const char *ptr;
  CURLcode result = CURLE_OK;
  Curl_dyn_init(&out, DYN_DICT_WORD);

  /* According to RFC2229 section 2.2, these letters need to be escaped with
     \[letter] */
  for(ptr = input; *ptr; ptr++) {
    char ch = *ptr;
    if((ch <= 32) || (ch == 127) ||
       (ch == '\'') || (ch == '\"') || (ch == '\\'))
      result = Curl_dyn_addn(&out, "\\", 1);
    if(!result)
      result = Curl_dyn_addn(&out, ptr, 1);
    if(result)
      return NULL;
  }
  return Curl_dyn_ptr(&out);
}